

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Type __thiscall wasm::TranslateToFuzzReader::getStorableType(TranslateToFuzzReader *this)

{
  FeatureOptions<wasm::Type> *pFVar1;
  Type local_78;
  FeatureSet local_6c;
  Type local_68 [3];
  FeatureSet local_4c;
  FeatureOptions<wasm::Type> local_48;
  TranslateToFuzzReader *local_18;
  TranslateToFuzzReader *this_local;
  
  local_48.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_48.options._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_48.options._M_t._M_impl._0_8_ = 0;
  local_48.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_18 = this;
  Random::FeatureOptions<wasm::Type>::FeatureOptions(&local_48);
  FeatureSet::FeatureSet(&local_4c,0);
  Type::Type(local_68,i32);
  pFVar1 = Random::FeatureOptions<wasm::Type>::
           add<wasm::Type::BasicType,wasm::Type::BasicType,wasm::Type::BasicType>
                     (&local_48,local_4c,local_68[0],i64,f32,f64);
  FeatureSet::FeatureSet(&local_6c,8);
  Type::Type(&local_78,v128);
  pFVar1 = Random::FeatureOptions<wasm::Type>::add<>(pFVar1,local_6c,local_78);
  this_local = (TranslateToFuzzReader *)pick<wasm::Type>(this,pFVar1);
  Random::FeatureOptions<wasm::Type>::~FeatureOptions(&local_48);
  return (Type)(uintptr_t)this_local;
}

Assistant:

Type TranslateToFuzzReader::getStorableType() {
  return pick(
    FeatureOptions<Type>()
      .add(FeatureSet::MVP, Type::i32, Type::i64, Type::f32, Type::f64)
      .add(FeatureSet::SIMD, Type::v128));
}